

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall gl3cts::TransformFeedback::DrawXFBInstanced::clean(DrawXFBInstanced *this)

{
  int iVar1;
  undefined4 uVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLuint position_location;
  Functions *gl;
  DrawXFBInstanced *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x1680))(0);
  if (this->m_program_id_generate != 0) {
    (**(code **)(lVar4 + 0x448))(this->m_program_id_generate);
    this->m_program_id_generate = 0;
  }
  if (this->m_program_id_draw != 0) {
    uVar2 = (**(code **)(lVar4 + 0x780))(this->m_program_id_draw,"position");
    (**(code **)(lVar4 + 0x518))(uVar2);
    (**(code **)(lVar4 + 0x448))(this->m_program_id_draw);
    this->m_program_id_draw = 0;
  }
  if (this->m_xfb_id != 0) {
    (**(code **)(lVar4 + 0x488))(1,&this->m_xfb_id);
    this->m_xfb_id = 0;
  }
  if (this->m_bo_id_xfb != 0) {
    (**(code **)(lVar4 + 0x438))(1,&this->m_bo_id_xfb);
    this->m_bo_id_xfb = 0;
  }
  if (this->m_bo_id_uniform != 0) {
    (**(code **)(lVar4 + 0x438))(1,&this->m_bo_id_uniform);
    this->m_bo_id_uniform = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar4 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  return;
}

Assistant:

void gl3cts::TransformFeedback::DrawXFBInstanced::clean()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(0);

	if (m_program_id_generate)
	{
		gl.deleteProgram(m_program_id_generate);

		m_program_id_generate = 0;
	}

	if (m_program_id_draw)
	{
		glw::GLuint position_location = gl.getAttribLocation(m_program_id_draw, "position");

		gl.disableVertexAttribArray(position_location);

		gl.deleteProgram(m_program_id_draw);

		m_program_id_draw = 0;
	}

	if (m_xfb_id)
	{
		gl.deleteTransformFeedbacks(1, &m_xfb_id);

		m_xfb_id = 0;
	}

	if (m_bo_id_xfb)
	{
		gl.deleteBuffers(1, &m_bo_id_xfb);

		m_bo_id_xfb = 0;
	}

	if (m_bo_id_uniform)
	{
		gl.deleteBuffers(1, &m_bo_id_uniform);

		m_bo_id_uniform = 0;
	}

	if (m_vao_id)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}